

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

uri * __thiscall jsoncons::uri::base(uri *this)

{
  uri *in_RDI;
  undefined8 in_R9;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  
  local_28 = scheme((uri *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_38 = encoded_userinfo((uri *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_48 = host((uri *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_58 = port((uri *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_68 = encoded_path((uri *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88);
  uri(in_RDI,local_28._M_len,local_28._M_str,local_38._M_len,local_38._M_str,in_R9,
      (undefined4)local_48._M_len,local_48._M_str._0_4_,local_58._M_len,local_58._M_str,
      local_68._M_len,local_68._M_str,local_78._M_len,local_78._M_str,local_88._M_len,
      local_88._M_str);
  return in_RDI;
}

Assistant:

uri base() const noexcept 
        { 
            return uri{uri_encoded_part, scheme(), encoded_userinfo(), host(), port(), encoded_path(), 
                jsoncons::string_view{}, jsoncons::string_view{}};
        }